

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::BackUpInputToCurrentPosition(CodedInputStream *this)

{
  int iVar1;
  uint uVar2;
  int backup_bytes;
  CodedInputStream *this_local;
  
  iVar1 = BufferSize(this);
  uVar2 = iVar1 + this->buffer_size_after_limit_ + this->overflow_bytes_;
  if (0 < (int)uVar2) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])(this->input_,(ulong)uVar2);
    iVar1 = BufferSize(this);
    this->total_bytes_read_ = this->total_bytes_read_ - (iVar1 + this->buffer_size_after_limit_);
    this->buffer_end_ = this->buffer_;
    this->buffer_size_after_limit_ = 0;
    this->overflow_bytes_ = 0;
  }
  return;
}

Assistant:

void CodedInputStream::BackUpInputToCurrentPosition() {
  int backup_bytes = BufferSize() + buffer_size_after_limit_ + overflow_bytes_;
  if (backup_bytes > 0) {
    input_->BackUp(backup_bytes);

    // total_bytes_read_ doesn't include overflow_bytes_.
    total_bytes_read_ -= BufferSize() + buffer_size_after_limit_;
    buffer_end_ = buffer_;
    buffer_size_after_limit_ = 0;
    overflow_bytes_ = 0;
  }
}